

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float_const&,float_const&,pbrt::SampledSpectrum_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
               (string *s,char *fmt,float *v,float *args,SampledSpectrum *args_1,float *args_2,
               float *args_3,float *args_4,float *args_5,float *args_6,float *args_7,int *args_8,
               int *args_9,int *args_10,int *args_11,int *args_12,int *args_13,int *args_14,
               int *args_15,int *args_16,MajorantGrid **args_17)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  string *in_RCX;
  float *in_RDX;
  float *unaff_RBP;
  string *in_RDI;
  char *in_R8;
  float *in_R9;
  float *unaff_R15;
  float *unaff_retaddr;
  float *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int *in_stack_00000050;
  MajorantGrid **in_stack_00000058;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcd0;
  char **in_stack_fffffffffffffcd8;
  char **in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  LogLevel in_stack_fffffffffffffd74;
  string local_288 [32];
  undefined8 local_268;
  string local_260 [12];
  float in_stack_fffffffffffffdac;
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [53];
  byte local_83;
  byte local_82;
  byte local_81;
  string local_80 [8];
  float *in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  SampledSpectrum *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  lVar2 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar2 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
             in_stack_fffffffffffffd58);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffdac);
    std::__cxx11::string::operator+=(in_RDI,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    if ((local_83 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
               in_stack_fffffffffffffd58);
    }
    if ((local_82 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                 in_stack_fffffffffffffd58);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffce8,(float *)in_stack_fffffffffffffce0);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd58);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_240);
      std::ostream::operator<<(local_230,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_268 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      std::__cxx11::string::operator+=(in_RDI,local_260);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::stringstream::~stringstream(local_240);
    }
  }
  stringPrintfRecursive<float_const&,pbrt::SampledSpectrum_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}